

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

void trial::protocol::serialization::
     save_overloader<trial::protocol::json::basic_oarchive<char>,_trial::dynamic::basic_variable<std::allocator<char>_>,_void>
     ::save(basic_oarchive<char> *ar,variable *data,uint protocol_version)

{
  basic_variable<std::allocator<char>_> *this;
  variable *pvVar1;
  bool bVar2;
  value vVar3;
  error *this_00;
  const_reference pbVar4;
  const_iterator local_118;
  undefined1 local_100 [8];
  const_iterator it;
  basic_variable<std::allocator<char>_> *item;
  const_iterator __end4;
  const_iterator __begin4;
  variable *__range4;
  type local_98;
  longdouble local_78;
  type_conflict9 local_60;
  type_conflict8 local_54;
  type_conflict7 local_50;
  type_conflict6 local_48;
  type_conflict7 local_40;
  type_conflict6 local_38;
  type_conflict5 local_2c;
  type_conflict4 local_28;
  type_conflict3 local_24;
  type_conflict2 local_22;
  type_conflict1 local_1f;
  type_conflict local_1e;
  bool local_1d;
  uint local_1c;
  variable *pvStack_18;
  uint protocol_version_local;
  variable *data_local;
  basic_oarchive<char> *ar_local;
  
  local_1c = protocol_version;
  pvStack_18 = data;
  data_local = (variable *)ar;
  vVar3 = dynamic::basic_variable<std::allocator<char>_>::code(data);
  pvVar1 = data_local;
  switch(vVar3) {
  case null:
    json::basic_oarchive<char>::save<trial::protocol::json::token::null>
              ((basic_oarchive<char> *)data_local);
    break;
  case boolean:
    local_1d = dynamic::basic_variable<std::allocator<char>_>::value<bool>(pvStack_18);
    json::basic_oarchive<char>::save<bool>((basic_oarchive<char> *)pvVar1,&local_1d);
    break;
  case signed_char:
    local_1e = dynamic::basic_variable<std::allocator<char>_>::value<signed_char>(pvStack_18);
    json::basic_oarchive<char>::save<signed_char>((basic_oarchive<char> *)pvVar1,&local_1e);
    break;
  case unsigned_char:
    local_1f = dynamic::basic_variable<std::allocator<char>_>::value<unsigned_char>(pvStack_18);
    json::basic_oarchive<char>::save<unsigned_char>((basic_oarchive<char> *)pvVar1,&local_1f);
    break;
  case signed_short_integer:
    local_22 = dynamic::basic_variable<std::allocator<char>_>::value<short>(pvStack_18);
    json::basic_oarchive<char>::save<short>((basic_oarchive<char> *)pvVar1,&local_22);
    break;
  case unsigned_short_integer:
    local_24 = dynamic::basic_variable<std::allocator<char>_>::value<unsigned_short>(pvStack_18);
    json::basic_oarchive<char>::save<unsigned_short>((basic_oarchive<char> *)pvVar1,&local_24);
    break;
  case signed_integer:
    local_28 = dynamic::basic_variable<std::allocator<char>_>::value<int>(pvStack_18);
    json::basic_oarchive<char>::save<int>((basic_oarchive<char> *)pvVar1,&local_28);
    break;
  case unsigned_integer:
    local_2c = dynamic::basic_variable<std::allocator<char>_>::value<unsigned_int>(pvStack_18);
    json::basic_oarchive<char>::save<unsigned_int>((basic_oarchive<char> *)pvVar1,&local_2c);
    break;
  case signed_long_integer:
    local_38 = dynamic::basic_variable<std::allocator<char>_>::value<long>(pvStack_18);
    json::basic_oarchive<char>::save<long>((basic_oarchive<char> *)pvVar1,&local_38);
    break;
  case unsigned_long_integer:
    local_40 = dynamic::basic_variable<std::allocator<char>_>::value<unsigned_long>(pvStack_18);
    json::basic_oarchive<char>::save<unsigned_long>((basic_oarchive<char> *)pvVar1,&local_40);
    break;
  case signed_long_long_integer:
    local_48 = dynamic::basic_variable<std::allocator<char>_>::value<long_long>(pvStack_18);
    json::basic_oarchive<char>::save<long_long>((basic_oarchive<char> *)pvVar1,&local_48);
    break;
  case unsigned_long_long_integer:
    local_50 = dynamic::basic_variable<std::allocator<char>_>::value<unsigned_long_long>(pvStack_18)
    ;
    json::basic_oarchive<char>::save<unsigned_long_long>((basic_oarchive<char> *)pvVar1,&local_50);
    break;
  case float_number:
    local_54 = dynamic::basic_variable<std::allocator<char>_>::value<float>(pvStack_18);
    json::basic_oarchive<char>::save<float>((basic_oarchive<char> *)pvVar1,&local_54);
    break;
  case double_number:
    local_60 = dynamic::basic_variable<std::allocator<char>_>::value<double>(pvStack_18);
    json::basic_oarchive<char>::save<double>((basic_oarchive<char> *)pvVar1,&local_60);
    break;
  case long_double_number:
    dynamic::basic_variable<std::allocator<char>_>::value<long_double>
              ((type_conflict10 *)pvStack_18,data);
    json::basic_oarchive<char>::save<long_double>((basic_oarchive<char> *)pvVar1,&local_78);
    break;
  case string:
    dynamic::basic_variable<std::allocator<char>_>::value<trial::dynamic::string>
              (&local_98,pvStack_18);
    json::basic_oarchive<char>::save<std::__cxx11::string>((basic_oarchive<char> *)pvVar1,&local_98)
    ;
    std::__cxx11::string::~string((string *)&local_98);
    break;
  case wstring:
  case u16string:
  case u32string:
    this_00 = (error *)__cxa_allocate_exception(0x20);
    json::error::error(this_00,incompatible_type);
    __cxa_throw(this_00,&json::error::typeinfo,json::error::~error);
  case array:
    json::basic_oarchive<char>::save<trial::protocol::json::token::begin_array>
              ((basic_oarchive<char> *)data_local);
    this = pvStack_18;
    dynamic::basic_variable<std::allocator<char>_>::begin
              ((const_iterator *)
               &__end4.
                super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                .current.current,pvStack_18);
    dynamic::basic_variable<std::allocator<char>_>::end((const_iterator *)&item,this);
    while (bVar2 = dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator!=
                             ((const_iterator *)
                              &__end4.
                               super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                               .current.current,(const_iterator *)&item), bVar2) {
      it.
      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
      .current._8_8_ =
           dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator*
                     ((const_iterator *)
                      &__end4.
                       super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                       .current.current);
      json::basic_oarchive<char>::
      save_override<trial::dynamic::basic_variable<std::allocator<char>>>
                ((basic_oarchive<char> *)data_local,
                 (basic_variable<std::allocator<char>_> *)
                 it.
                 super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                 .current._8_8_,(ulong)local_1c);
      dynamic::basic_variable<std::allocator<char>_>::
      iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
      ::operator++((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                    *)&__end4.
                       super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                       .current.current);
    }
    dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
              ((const_iterator *)&item);
    dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
              ((const_iterator *)
               &__end4.
                super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                .current.current);
    json::basic_oarchive<char>::save<trial::protocol::json::token::end_array>
              ((basic_oarchive<char> *)data_local);
    break;
  case map:
    json::basic_oarchive<char>::save<trial::protocol::json::token::begin_object>
              ((basic_oarchive<char> *)data_local);
    dynamic::basic_variable<std::allocator<char>_>::begin((const_iterator *)local_100,pvStack_18);
    while( true ) {
      dynamic::basic_variable<std::allocator<char>_>::end(&local_118,pvStack_18);
      bVar2 = dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator!=
                        ((const_iterator *)local_100,&local_118);
      dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_118);
      pvVar1 = data_local;
      if (!bVar2) break;
      pbVar4 = dynamic::basic_variable<std::allocator<char>_>::const_iterator::key
                         ((const_iterator *)local_100);
      json::basic_oarchive<char>::
      save_override<trial::dynamic::basic_variable<std::allocator<char>>>
                ((basic_oarchive<char> *)pvVar1,pbVar4,(ulong)local_1c);
      pvVar1 = data_local;
      pbVar4 = dynamic::basic_variable<std::allocator<char>_>::const_iterator::value
                         ((const_iterator *)local_100);
      json::basic_oarchive<char>::
      save_override<trial::dynamic::basic_variable<std::allocator<char>>>
                ((basic_oarchive<char> *)pvVar1,pbVar4,(ulong)local_1c);
      dynamic::basic_variable<std::allocator<char>_>::
      iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
      ::operator++((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                    *)local_100);
    }
    dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
              ((const_iterator *)local_100);
    json::basic_oarchive<char>::save<trial::protocol::json::token::end_object>
              ((basic_oarchive<char> *)data_local);
  }
  return;
}

Assistant:

static void save(protocol::json::basic_oarchive<CharT>& ar,
                     const dynamic::variable& data,
                     const unsigned int protocol_version)
    {
        switch (data.code())
        {
        case dynamic::code::null:
            ar.template save<json::token::null>();
            break;

        case dynamic::code::boolean:
            ar.save(data.value<bool>());
            break;

        case dynamic::code::signed_char:
            ar.save(data.value<signed char>());
            break;

        case dynamic::code::unsigned_char:
            ar.save(data.value<unsigned char>());
            break;

        case dynamic::code::signed_short_integer:
            ar.save(data.value<signed short int>());
            break;

        case dynamic::code::unsigned_short_integer:
            ar.save(data.value<unsigned short int>());
            break;

        case dynamic::code::signed_integer:
            ar.save(data.value<signed int>());
            break;

        case dynamic::code::unsigned_integer:
            ar.save(data.value<unsigned int>());
            break;

        case dynamic::code::signed_long_integer:
            ar.save(data.value<signed long int>());
            break;

        case dynamic::code::unsigned_long_integer:
            ar.save(data.value<unsigned long int>());
            break;

        case dynamic::code::signed_long_long_integer:
            ar.save(data.value<signed long long int>());
            break;

        case dynamic::code::unsigned_long_long_integer:
            ar.save(data.value<unsigned long long int>());
            break;

        case dynamic::code::real:
            ar.save(data.value<float>());
            break;

        case dynamic::code::long_real:
            ar.save(data.value<double>());
            break;

        case dynamic::code::long_long_real:
            ar.save(data.value<long double>());
            break;

        case dynamic::code::string:
            ar.save(data.value<dynamic::string>());
            break;

        case dynamic::code::wstring:
        case dynamic::code::u16string:
        case dynamic::code::u32string:
            throw json::error(json::incompatible_type);

        case dynamic::code::array:
            ar.template save<json::token::begin_array>();
            for (const auto& item : data)
            {
                ar.save_override(item, protocol_version);
            }
            ar.template save<json::token::end_array>();
            break;

        case dynamic::code::map:
            ar.template save<json::token::begin_object>();
            for (auto it = data.begin(); it != data.end(); ++it)
            {
                ar.save_override(it.key(), protocol_version);
                ar.save_override(it.value(), protocol_version);
            }
            ar.template save<json::token::end_object>();
            break;
        }
    }